

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Question * __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::erase
          (Question *__return_storage_ptr__,
          ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint id,Question *entry)

{
  uint local_4c;
  Entry local_48;
  
  local_4c = id;
  if ((int)id < 0) {
    kj::
    Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
    ::find<0ul,unsigned_int&>
              ((Table<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,kj::HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>>
                *)&local_48,(uint *)&this->highSlots);
    if ((Exception *)local_48._0_8_ == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xed,FAILED,"highSlots.findEntry(id) != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&local_48);
    }
    kj::
    Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>_>
    ::release(&local_48,&(this->highSlots).table,(Entry *)local_48._0_8_);
    (__return_storage_ptr__->paramExports).ptr = local_48.value.paramExports.ptr;
    (__return_storage_ptr__->paramExports).size_ = local_48.value.paramExports.size_;
    local_48.value.paramExports.ptr = (uint *)0x0;
    local_48.value.paramExports.size_ = 0;
    (__return_storage_ptr__->paramExports).disposer = local_48.value.paramExports.disposer;
    (__return_storage_ptr__->selfRef).ptr = local_48.value.selfRef.ptr;
    local_48.value.selfRef.ptr = (QuestionRef *)0x0;
    __return_storage_ptr__->skipFinish = local_48.value.skipFinish;
    __return_storage_ptr__->isAwaitingReturn = local_48.value.isAwaitingReturn;
    __return_storage_ptr__->isTailCall = local_48.value.isTailCall;
    kj::Array<unsigned_int>::~Array(&local_48.value.paramExports);
  }
  else {
    RpcSystemBase::RpcConnectionState::Question::Question
              (__return_storage_ptr__,(this->slots).builder.ptr + id);
    local_48.value.selfRef.ptr = (QuestionRef *)0x0;
    local_48.value.paramExports.size_ = 0;
    local_48.value.paramExports.disposer = (ArrayDisposer *)0x0;
    local_48._0_8_ = (Exception *)0x0;
    local_48.value.paramExports.ptr = (uint *)0x0;
    RpcSystemBase::RpcConnectionState::Question::operator=
              ((this->slots).builder.ptr + id,(Question *)&local_48);
    kj::Array<unsigned_int>::~Array((Array<unsigned_int> *)&local_48);
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::push(&this->freeIds,&local_4c);
  }
  return __return_storage_ptr__;
}

Assistant:

T erase(Id id, T& entry) {
    // Remove an entry from the table and return it.  We return it so that the caller can be
    // careful to release it (possibly invoking arbitrary destructors) at a time that makes sense.
    // `entry` is a reference to the entry being released -- we require this in order to prove
    // that the caller has already done a find() to check that this entry exists.  We can't check
    // ourselves because the caller may have nullified the entry in the meantime.

    if (isHigh(id)) {
      auto& slot = KJ_REQUIRE_NONNULL(highSlots.findEntry(id));
      return highSlots.release(slot).value;
    } else {
      KJ_DREQUIRE(&entry == &slots[id]);
      T toRelease = kj::mv(slots[id]);
      slots[id] = T();
      freeIds.push(id);
      return toRelease;
    }
  }